

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

void ssh_bpp_output_raw_data_callback(void *vctx)

{
  size_t sVar1;
  ptrlen pVar2;
  void *local_30;
  ptrlen data;
  size_t backlog;
  Ssh *ssh;
  void *vctx_local;
  
  if (*vctx != 0) {
    do {
      sVar1 = bufchain_size((bufchain *)((long)vctx + 0x118));
      if (sVar1 == 0) {
        ssh_check_frozen((Ssh *)vctx);
        if ((*(byte *)((long)vctx + 0x168) & 1) == 0) {
          return;
        }
        sk_close(*vctx);
        *(undefined8 *)vctx = 0;
        seat_notify_remote_disconnect(*(Seat **)((long)vctx + 8));
        return;
      }
      pVar2 = bufchain_prefix((bufchain *)((long)vctx + 0x118));
      local_30 = pVar2.ptr;
      data.ptr = (void *)pVar2.len;
      if (*(long *)((long)vctx + 0x60) != 0) {
        log_packet(*(LogContext **)((long)vctx + 0x60),1,-1,(char *)0x0,local_30,(size_t)data.ptr,0,
                   (logblank_t *)0x0,(unsigned_long *)0x0,0,(char *)0x0);
      }
      sVar1 = sk_write(*vctx,local_30,(size_t)data.ptr);
      bufchain_consume((bufchain *)((long)vctx + 0x118),(size_t)data.ptr);
    } while (sVar1 < 0x8001);
    ssh_throttle_all((Ssh *)vctx,true,sVar1);
  }
  return;
}

Assistant:

static void ssh_bpp_output_raw_data_callback(void *vctx)
{
    Ssh *ssh = (Ssh *)vctx;

    if (!ssh->s)
        return;

    while (bufchain_size(&ssh->out_raw) > 0) {
        size_t backlog;

        ptrlen data = bufchain_prefix(&ssh->out_raw);

        if (ssh->logctx)
            log_packet(ssh->logctx, PKT_OUTGOING, -1, NULL, data.ptr, data.len,
                       0, NULL, NULL, 0, NULL);
        backlog = sk_write(ssh->s, data.ptr, data.len);

        bufchain_consume(&ssh->out_raw, data.len);

        if (backlog > SSH_MAX_BACKLOG) {
            ssh_throttle_all(ssh, true, backlog);
            return;
        }
    }

    ssh_check_frozen(ssh);

    if (ssh->pending_close) {
        sk_close(ssh->s);
        ssh->s = NULL;
        seat_notify_remote_disconnect(ssh->seat);
    }
}